

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void do_detect_movement(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  char *txt;
  long lVar5;
  AFFECT_DATA local_90;
  
  bVar2 = is_affected(ch,(int)gsn_detect_movement);
  if (bVar2) {
    txt = "You are already listening closely.\n\r";
  }
  else {
    iVar3 = get_skill(ch,(int)gsn_detect_movement);
    if (iVar3 != 0) {
      sVar1 = ch->level;
      lVar5 = (long)gsn_detect_movement;
      this = char_data::Class(ch);
      iVar4 = CClass::GetIndex(this);
      if (*(short *)(lVar5 * 0x60 + 0x4ab788 + (long)iVar4 * 2) <= sVar1) {
        iVar4 = number_percent();
        if (iVar4 <= iVar3) {
          init_affect(&local_90);
          local_90.where = 0;
          local_90.aftype = 5;
          local_90.type = gsn_detect_movement;
          local_90.level = ch->level;
          local_90.location = 0;
          local_90.modifier = 0;
          local_90.mod_name = 0xb;
          local_90.duration = local_90.level;
          affect_to_char(ch,&local_90);
        }
        check_improve(ch,(int)gsn_detect_movement,iVar4 <= iVar3,2);
        send_to_char("You listen intently to your surroundings.\n\r",ch);
        return;
      }
    }
    txt = "Huh?\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_detect_movement(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int number;

	if (is_affected(ch, gsn_detect_movement))
	{
		send_to_char("You are already listening closely.\n\r", ch);
		return;
	}

	number = get_skill(ch, gsn_detect_movement);

	if (number == 0
		|| ch->level < skill_table[gsn_detect_movement].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (number_percent() > number)
	{
		check_improve(ch, gsn_detect_movement, false, 2);
	}
	else
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_detect_movement;
		af.level = ch->level;
		af.duration = ch->level;
		af.location = ch->level / 2;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.mod_name = MOD_PERCEPTION;
		affect_to_char(ch, &af);

		check_improve(ch, gsn_detect_movement, true, 2);
	}

	send_to_char("You listen intently to your surroundings.\n\r", ch);
}